

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaStr.c
# Opt level: O1

Vec_Int_t * Str_ManCreateRoots(Vec_Wec_t *vGroups,int nObjs)

{
  int iVar1;
  Vec_Int_t *pVVar2;
  int *piVar3;
  Vec_Int_t *pVVar4;
  int *__s;
  int iVar5;
  long lVar6;
  long lVar7;
  
  pVVar4 = (Vec_Int_t *)malloc(0x10);
  iVar5 = 0x10;
  if (0xe < nObjs - 1U) {
    iVar5 = nObjs;
  }
  pVVar4->nSize = 0;
  pVVar4->nCap = iVar5;
  if (iVar5 == 0) {
    __s = (int *)0x0;
  }
  else {
    __s = (int *)malloc((long)iVar5 << 2);
  }
  pVVar4->pArray = __s;
  pVVar4->nSize = nObjs;
  if (__s != (int *)0x0) {
    memset(__s,0xff,(long)nObjs << 2);
  }
  iVar5 = vGroups->nSize;
  if (0 < (long)iVar5) {
    pVVar2 = vGroups->pArray;
    lVar6 = 0;
    do {
      if (0 < pVVar2[lVar6].nSize) {
        piVar3 = pVVar2[lVar6].pArray;
        lVar7 = 0;
        do {
          iVar1 = piVar3[lVar7];
          if (((long)iVar1 < 0) || (nObjs <= iVar1)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                          ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
          }
          __s[iVar1] = (int)lVar6;
          lVar7 = lVar7 + 1;
        } while (lVar7 < pVVar2[lVar6].nSize);
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 != iVar5);
  }
  return pVVar4;
}

Assistant:

Vec_Int_t * Str_ManCreateRoots( Vec_Wec_t * vGroups, int nObjs )
{   // map tree MUXes into their classes
    Vec_Int_t * vRoots;
    Vec_Int_t * vGroup;
    int i, k, Entry;
    vRoots = Vec_IntStartFull( nObjs );
    Vec_WecForEachLevel( vGroups, vGroup, i )
        Vec_IntForEachEntry( vGroup, Entry, k )
            Vec_IntWriteEntry( vRoots, Entry, i );
    return vRoots;
}